

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O1

int tc_uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,tc_uECC_Curve curve)

{
  char cVar1;
  cmpresult_t cVar2;
  tc_uECC_word_t tVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  tc_uECC_word_t local_88 [2];
  tc_uECC_word_t _public [16];
  tc_uECC_word_t _private [8];
  
  iVar10 = (int)curve->num_n_bits;
  iVar5 = iVar10 + 0xe;
  if (-1 < iVar10 + 7) {
    iVar5 = iVar10 + 7;
  }
  tc_uECC_vli_bytesToNative(_public + 0xe,private_key,iVar5 >> 3);
  iVar5 = iVar10 + 0x3e;
  if (-1 < iVar10 + 0x1f) {
    iVar5 = iVar10 + 0x1f;
  }
  cVar9 = (char)(iVar5 >> 5);
  if (cVar9 < '\x01') {
    iVar5 = 0;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 | _public[uVar4 + 0xe];
      uVar4 = uVar4 + 1;
    } while ((iVar5 >> 5 & 0x7f) != uVar4);
    iVar5 = 0;
    if (((uVar6 != 0) &&
        (cVar2 = tc_uECC_vli_cmp(curve->n,_public + 0xe,cVar9), iVar5 = 0, cVar2 == '\x01')) &&
       (tVar3 = EccPoint_compute_public_key(local_88,_public + 0xe,curve), tVar3 != 0)) {
      uVar6 = (uint)curve->num_bytes;
      if ('\0' < curve->num_bytes) {
        lVar7 = (long)(int)uVar6;
        iVar5 = uVar6 * 8;
        lVar8 = 0;
        do {
          iVar5 = iVar5 + -8;
          uVar6 = uVar6 - 1;
          public_key[lVar8] =
               (uint8_t)(*(uint *)((long)local_88 + (ulong)(uVar6 & 0xfffffffc)) >>
                        ((byte)iVar5 & 0x18));
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      cVar9 = curve->num_bytes;
      iVar5 = 1;
      if (0 < (long)cVar9) {
        cVar1 = curve->num_words;
        uVar6 = (uint)cVar9;
        lVar7 = (long)(int)uVar6;
        iVar10 = uVar6 * 8;
        lVar8 = 0;
        do {
          uVar6 = uVar6 - 1;
          iVar10 = iVar10 + -8;
          public_key[lVar8 + cVar9] =
               (uint8_t)(*(uint *)((long)_public +
                                  (ulong)(uVar6 & 0xfffffffc) + (long)cVar1 * 4 + -8) >>
                        ((byte)iVar10 & 0x18));
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
    }
  }
  return iVar5;
}

Assistant:

int tc_uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key,
			    tc_uECC_Curve curve)
{

	tc_uECC_word_t _private[NUM_ECC_WORDS];
	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(
	_private,
	private_key,
	BITS_TO_BYTES(curve->num_n_bits));

	/* Make sure the private key is in the range [1, n-1]. */
	if (tc_uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
		return 0;
	}

	if (tc_uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
		return 0;
	}

	/* Compute public key. */
	if (!EccPoint_compute_public_key(_public, _private, curve)) {
		return 0;
	}

	tc_uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
	tc_uECC_vli_nativeToBytes(
	public_key +
	curve->num_bytes, curve->num_bytes, _public + curve->num_words);
	return 1;
}